

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicAPIGet::Run(BasicAPIGet *this)

{
  bool bVar1;
  char *format;
  
  bVar1 = ShaderImageLoadStoreBase::CheckMax(&this->super_ShaderImageLoadStoreBase,0x8f38,8);
  if (bVar1) {
    bVar1 = ShaderImageLoadStoreBase::CheckMax(&this->super_ShaderImageLoadStoreBase,0x8f39,8);
    if (bVar1) {
      bVar1 = ShaderImageLoadStoreBase::CheckMax(&this->super_ShaderImageLoadStoreBase,0x906d,0);
      if (bVar1) {
        bVar1 = ShaderImageLoadStoreBase::CheckMax(&this->super_ShaderImageLoadStoreBase,0x90ca,0);
        if (bVar1) {
          bVar1 = ShaderImageLoadStoreBase::CheckMax(&this->super_ShaderImageLoadStoreBase,0x90cc,0)
          ;
          if (bVar1) {
            bVar1 = ShaderImageLoadStoreBase::CheckMax
                              (&this->super_ShaderImageLoadStoreBase,0x90cb,0);
            if (bVar1) {
              bVar1 = ShaderImageLoadStoreBase::CheckMax
                                (&this->super_ShaderImageLoadStoreBase,0x90cd,0);
              if (bVar1) {
                bVar1 = ShaderImageLoadStoreBase::CheckMax
                                  (&this->super_ShaderImageLoadStoreBase,0x90ce,8);
                if (bVar1) {
                  bVar1 = ShaderImageLoadStoreBase::CheckMax
                                    (&this->super_ShaderImageLoadStoreBase,0x90cf,8);
                  if (bVar1) {
                    return 0;
                  }
                  format = "GL_MAX_COMBINED_IMAGE_UNIFORMS value is invalid.\n";
                }
                else {
                  format = "GL_MAX_FRAGMENT_IMAGE_UNIFORMS value is invalid.\n";
                }
              }
              else {
                format = "GL_MAX_GEOMETRY_IMAGE_UNIFORMS value is invalid.\n";
              }
            }
            else {
              format = "GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS value is invalid.\n";
            }
          }
          else {
            format = "GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS value is invalid.\n";
          }
        }
        else {
          format = "GL_MAX_VERTEX_IMAGE_UNIFORMS value is invalid.\n";
        }
      }
      else {
        format = "GL_MAX_IMAGE_SAMPLES value is invalid.\n";
      }
    }
    else {
      format = "GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES value is invalid.\n";
    }
  }
  else {
    format = "GL_MAX_IMAGE_UNITS value is invalid.\n";
  }
  anon_unknown_0::Output(format);
  return -1;
}

Assistant:

virtual long Run()
	{
		if (!CheckMax(GL_MAX_IMAGE_UNITS, 8))
		{
			Output("GL_MAX_IMAGE_UNITS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES, 8))
		{
			Output("GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_IMAGE_SAMPLES, 0))
		{
			Output("GL_MAX_IMAGE_SAMPLES value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_VERTEX_IMAGE_UNIFORMS, 0))
		{
			Output("GL_MAX_VERTEX_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS, 0))
		{
			Output("GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS, 0))
		{
			Output("GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_GEOMETRY_IMAGE_UNIFORMS, 0))
		{
			Output("GL_MAX_GEOMETRY_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_FRAGMENT_IMAGE_UNIFORMS, 8))
		{
			Output("GL_MAX_FRAGMENT_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		if (!CheckMax(GL_MAX_COMBINED_IMAGE_UNIFORMS, 8))
		{
			Output("GL_MAX_COMBINED_IMAGE_UNIFORMS value is invalid.\n");
			return ERROR;
		}
		return NO_ERROR;
	}